

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_map.cpp
# Opt level: O2

void PIT_FloorRaise(AActor *thing,FChangePosition *cpos)

{
  double oldz;
  double dVar1;
  player_t *ppVar2;
  int iVar3;
  double dVar4;
  
  oldz = (thing->__Pos).Z;
  dVar4 = thing->floorz;
  P_AdjustFloorCeil(thing,cpos);
  dVar1 = thing->floorz;
  if ((dVar4 == dVar1) && (!NAN(dVar4) && !NAN(dVar1))) {
    return;
  }
  if ((thing->__Pos).Z <= dVar1) {
    if (((thing->flags4).Value & 0x80) != 0) {
      cpos->nofit = true;
      return;
    }
    TArray<AActor_*,_AActor_*>::Clear(&intersectors);
    dVar4 = thing->floorz;
  }
  else {
    if (((thing->flags).Value & 0x200) == 0) {
      return;
    }
    if (-1 < (int)(thing->flags6).Value) {
      return;
    }
    TArray<AActor_*,_AActor_*>::Clear(&intersectors);
    dVar4 = (thing->floorz - dVar4) + (thing->__Pos).Z;
  }
  (thing->__Pos).Z = dVar4;
  iVar3 = P_PushUp(thing,cpos);
  if (iVar3 == 1) {
    P_DoCrunch(thing,cpos);
  }
  else if (iVar3 == 2) {
    P_DoCrunch(thing,cpos);
    (thing->__Pos).Z = oldz;
    goto LAB_004b3e8b;
  }
  P_CheckFakeFloorTriggers(thing,oldz,false);
  AActor::UpdateRenderSectorList(thing);
LAB_004b3e8b:
  ppVar2 = thing->player;
  if ((ppVar2 != (player_t *)0x0) && (ppVar2->mo == (APlayerPawn *)thing)) {
    ppVar2->viewz = ((thing->__Pos).Z - oldz) + ppVar2->viewz;
  }
  return;
}

Assistant:

void PIT_FloorRaise(AActor *thing, FChangePosition *cpos)
{
	double oldfloorz = thing->floorz;
	double oldz = thing->Z();

	P_AdjustFloorCeil(thing, cpos);

	if (oldfloorz == thing->floorz) return;

	// Move things intersecting the floor up
	if (thing->Z() <= thing->floorz)
	{
		if (thing->flags4 & MF4_ACTLIKEBRIDGE)
		{
			cpos->nofit = true;
			return; // do not move bridge things
		}
		intersectors.Clear();
		thing->SetZ(thing->floorz);
	}
	else
	{
		if ((thing->flags & MF_NOGRAVITY) && (thing->flags6 & MF6_RELATIVETOFLOOR))
		{
			intersectors.Clear();
			thing->AddZ(-oldfloorz + thing->floorz);
		}
		else return;
	}
	switch (P_PushUp(thing, cpos))
	{
	default:
		P_CheckFakeFloorTriggers(thing, oldz);
		thing->UpdateRenderSectorList();
		break;
	case 1:
		P_DoCrunch(thing, cpos);
		P_CheckFakeFloorTriggers(thing, oldz);
		thing->UpdateRenderSectorList();
		break;
	case 2:
		P_DoCrunch(thing, cpos);
		thing->SetZ(oldz);
		break;
	}
	if (thing->player && thing->player->mo == thing)
	{
		thing->player->viewz += thing->Z() - oldz;
	}
}